

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1ConvolveParametersTest_GetLowbdTestParams_Test::TestBody
          (AV1ConvolveParametersTest_GetLowbdTestParams_Test *this)

{
  bool bVar1;
  int line;
  AssertionResult gtest_ar_;
  bool same_fn;
  AssertionResult gtest_ar_1;
  TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
  *p;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  *__range1;
  AssertionResult gtest_ar;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  v;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
  *in_stack_fffffffffffffed8;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffefc;
  Type type;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  *this_00;
  string local_f8 [40];
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_98;
  reference local_88;
  TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
  *local_80;
  __normal_iterator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_*,_std::vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>_>
  local_78;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  *local_70;
  uint local_64;
  size_type local_40;
  undefined4 local_34;
  AssertionResult local_30;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  local_20;
  
  this_00 = &local_20;
  (anonymous_namespace)::
  GetLowbdTestParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
            ((_func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
              *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_34 = 0x1b;
  local_40 = std::
             vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
             ::size(this_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (char *)in_stack_fffffffffffffee0,(uint *)in_stack_fffffffffffffed8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffef0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x93e472);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               (char *)in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff50,
               (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::Message::~Message((Message *)0x93e4cf);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x93e53d);
  if (local_64 == 0) {
    local_70 = &local_20;
    local_78._M_current =
         (TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
          *)std::
            vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
            ::begin(in_stack_fffffffffffffec8);
    local_80 = (TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
                *)std::
                  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
                  ::end(in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_*,_std::vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                              (__normal_iterator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_*,_std::vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_*,_std::vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>_>
                 ::operator*(&local_78);
      line = TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
             ::BitDepth(local_88);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT44(line,in_stack_fffffffffffffee8),(char *)in_stack_fffffffffffffee0,
                 (int *)in_stack_fffffffffffffed8,
                 (int *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
      in_stack_fffffffffffffee8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee8);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffee0 =
             (vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0x93e67a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,type,in_stack_fffffffffffffef0,line,
                   (char *)in_stack_fffffffffffffee0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff50,
                   (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        testing::Message::~Message((Message *)0x93e6d7);
      }
      local_64 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x93e745);
      if (local_64 != 0) goto LAB_0093e928;
      in_stack_fffffffffffffed8 =
           TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
           ::TestFunction(local_88);
      in_stack_ffffffffffffff4f = in_stack_fffffffffffffed8 == av1_convolve_x_sr_c;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 (bool *)in_stack_fffffffffffffec8,(type *)0x93e797);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff38);
      in_stack_fffffffffffffed7 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   (char *)in_stack_ffffffffffffff40._M_head_impl,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,type,in_stack_fffffffffffffef0,line,
                   (char *)in_stack_fffffffffffffee0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff50,
                   (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        std::__cxx11::string::~string(local_f8);
        testing::Message::~Message((Message *)0x93e86e);
      }
      local_64 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x93e8f0);
      if (local_64 != 0) goto LAB_0093e928;
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_*,_std::vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>_>
      ::operator++(&local_78);
    }
    local_64 = 0;
  }
LAB_0093e928:
  std::
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  ::~vector(in_stack_fffffffffffffee0);
  return;
}

Assistant:

TEST_F(AV1ConvolveParametersTest, GetLowbdTestParams) {
  auto v = GetLowbdTestParams(av1_convolve_x_sr_c);
  ASSERT_EQ(27U, v.size());
  for (const auto &p : v) {
    ASSERT_EQ(8, p.BitDepth());
    // Needed (instead of ASSERT_EQ(...) since gtest does not
    // have built in printing for arbitrary functions, which
    // causes a compilation error.
    bool same_fn = av1_convolve_x_sr_c == p.TestFunction();
    ASSERT_TRUE(same_fn);
  }
}